

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O2

bool __thiscall
jsoncons::jmespath::detail::
token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::
is_projection(token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *this)

{
  undefined1 uVar1;
  assertion_error *this_00;
  allocator<char> local_31;
  string local_30;
  
  if (this->type_ == expression) {
    if ((this->field_2).expression_ ==
        (expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
         *)0x0) {
      this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"assertion \'expression_ != nullptr\' failed at  <> :0",
                 &local_31);
      assertion_error::assertion_error(this_00,&local_30);
      __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = ((this->field_2).expression_)->is_projection_;
  }
  else {
    uVar1 = 0;
  }
  return (bool)uVar1;
}

Assistant:

bool is_expression() const
        {
            return type_ == token_kind::expression; 
        }